

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O0

Clause * __thiscall
Shell::PredicateDefinition::replacePurePredicates(PredicateDefinition *this,Clause *cl)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Literal **ppLVar4;
  Clause *in_RSI;
  uint *in_RDI;
  bool val;
  uint i;
  uint clen;
  bool *val_00;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_20;
  
  uVar2 = Kernel::Clause::length(in_RSI);
  local_20 = 0;
  while( true ) {
    if (uVar2 <= local_20) {
      return in_RSI;
    }
    val_00 = (bool *)(in_RDI + 0x10);
    ppLVar4 = Kernel::Clause::operator[](in_RSI,local_20);
    uVar3 = Kernel::Term::functor(&(*ppLVar4)->super_Term);
    bVar1 = Lib::DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      ((DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT44(in_stack_ffffffffffffffdc,uVar3),in_RDI,val_00);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  return (Clause *)0x0;
}

Assistant:

Clause* PredicateDefinition::replacePurePredicates(Clause* cl)
{
  unsigned clen=cl->length();
  for(unsigned i=0;i<clen;i++) {
    bool val;
    if(_purePreds.find((*cl)[i]->functor(), val)) {
      ASS_EQ((*cl)[i]->isPositive(), val);
      return 0;
    }
  }
  return cl;
}